

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

ImVec2 ImPlot::CalcLegendSize(ImPlotPlot *plot,ImVec2 *pad,ImVec2 *spacing,ImPlotOrientation orn)

{
  int iVar1;
  ImVec2 IVar2;
  char *text;
  int i;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = (plot->LegendData).Indices.Size;
  fVar3 = ImGui::GetTextLineHeight();
  if (iVar1 < 1) {
    fVar6 = 0.0;
    fVar4 = 0.0;
  }
  else {
    i = 0;
    fVar6 = 0.0;
    fVar5 = 0.0;
    do {
      text = ImPlotPlot::GetLegendLabel(plot,i);
      IVar2 = ImGui::CalcTextSize(text,(char *)0x0,true,-1.0);
      fVar4 = IVar2.x;
      fVar6 = fVar6 + fVar4;
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      i = i + 1;
      fVar5 = fVar4;
    } while (iVar1 != i);
  }
  fVar5 = pad->x;
  if (orn == 1) {
    fVar4 = fVar4 + fVar5 + fVar5 + fVar3;
    fVar3 = (float)(iVar1 + -1) * spacing->y + pad->y + pad->y + (float)iVar1 * fVar3;
  }
  else {
    fVar4 = fVar6 + fVar5 + fVar5 + (float)iVar1 * fVar3 + spacing->x * (float)(iVar1 + -1);
    fVar3 = fVar3 + pad->y * 2.0;
  }
  IVar2.y = fVar3;
  IVar2.x = fVar4;
  return IVar2;
}

Assistant:

ImVec2 CalcLegendSize(ImPlotPlot& plot, const ImVec2& pad, const ImVec2& spacing, ImPlotOrientation orn) {
    // vars
    const int   nItems      = plot.GetLegendCount();
    const float txt_ht      = ImGui::GetTextLineHeight();
    const float icon_size   = txt_ht;
    // get label max width
    float max_label_width = 0;
    float sum_label_width = 0;
    for (int i = 0; i < nItems; ++i) {
        const char* label       = plot.GetLegendLabel(i);
        const float label_width = ImGui::CalcTextSize(label, NULL, true).x;
        max_label_width         = label_width > max_label_width ? label_width : max_label_width;
        sum_label_width        += label_width;
    }
    // calc legend size
    const ImVec2 legend_size = orn == ImPlotOrientation_Vertical ?
                               ImVec2(pad.x * 2 + icon_size + max_label_width, pad.y * 2 + nItems * txt_ht + (nItems - 1) * spacing.y) :
                               ImVec2(pad.x * 2 + icon_size * nItems + sum_label_width + (nItems - 1) * spacing.x, pad.y * 2 + txt_ht);
    return legend_size;
}